

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall cmdline::parser::exist(parser *this,string *name)

{
  int iVar1;
  size_type sVar2;
  undefined8 uVar3;
  pointer ppVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  if (sVar2 == 0) {
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    uVar3 = __cxa_allocate_exception(0x28);
    std::operator+(in_RDI,in_RSI);
    cmdline_error::cmdline_error
              ((cmdline_error *)CONCAT44(in_stack_ffffffffffffffc4,uVar5),in_stack_ffffffffffffffb8)
    ;
    __cxa_throw(uVar3,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  ::find(in_stack_ffffffffffffffa8,(key_type *)0x18f040);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                         *)0x18f04f);
  iVar1 = (*ppVar4->second->_vptr_option_base[5])();
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool exist(const std::string& name) const {
        if (options.count(name) == 0) throw cmdline_error("there is no flag: --" + name);
        return options.find(name)->second->has_set();
    }